

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eh_frame.cc
# Opt level: O2

uint64_t bloaty::ReadEncodedPointer
                   (uint8_t encoding,bool is_64bit,string_view *data,char *data_base,RangeSink *sink
                   )

{
  char *pcVar1;
  unsigned_short uVar2;
  short sVar3;
  int iVar4;
  uint uVar5;
  unsigned_long address;
  uint64_t uVar6;
  RangeSink *pRVar7;
  string_view format;
  string_view format_00;
  string_view location;
  string local_50;
  
  if (0xc < (encoding & 0xf)) {
switchD_0019470f_caseD_5:
    absl::substitute_internal::Arg::Arg((Arg *)&location,(uint)(encoding & 0xf));
    format_00._M_str = (char *)&location;
    format_00._M_len = (size_t)"Unexpected eh_frame format value: $0";
    absl::Substitute_abi_cxx11_(&local_50,(absl *)0x24,format_00,(Arg *)sink);
    Throw(local_50._M_dataplus._M_p,0x44);
  }
  pcVar1 = data->_M_str;
  pRVar7 = sink;
  switch(encoding & 0xf) {
  case 0:
    if (!is_64bit) goto switchD_0019470f_caseD_3;
  case 4:
    address = ReadFixed<unsigned_long,8ul>(data);
    break;
  case 1:
    address = dwarf::ReadLEB128<unsigned_long>(data);
    break;
  case 2:
    uVar2 = ReadFixed<unsigned_short,2ul>(data);
    address = (unsigned_long)uVar2;
    break;
  case 3:
switchD_0019470f_caseD_3:
    uVar5 = ReadFixed<unsigned_int,4ul>(data);
    address = (unsigned_long)uVar5;
    break;
  default:
    goto switchD_0019470f_caseD_5;
  case 9:
    address = dwarf::ReadLEB128<long>(data);
    break;
  case 10:
    sVar3 = ReadFixed<short,2ul>(data);
    address = (unsigned_long)sVar3;
    break;
  case 0xb:
    iVar4 = ReadFixed<int,4ul>(data);
    address = (unsigned_long)iVar4;
    break;
  case 0xc:
    address = ReadFixed<long,8ul>(data);
  }
  switch((encoding & 0x70) - 0x10 >> 4) {
  case 0:
    data_base = pcVar1;
    break;
  case 1:
  case 3:
  case 4:
    absl::substitute_internal::Arg::Arg((Arg *)&location,(uint)(encoding & 0x70));
    format._M_str = (char *)&location;
    format._M_len = (size_t)"Unimplemented eh_frame application value: $0";
    absl::Substitute_abi_cxx11_(&local_50,(absl *)0x2c,format,(Arg *)pRVar7);
    Throw(local_50._M_dataplus._M_p,0x58);
  case 2:
    if (data_base == (char *)0x0) {
      Throw("datarel requested but no data_base provided",0x51);
    }
    break;
  default:
    goto switchD_00194786_default;
  }
  uVar6 = RangeSink::TranslateFileToVM(sink,data_base);
  address = address + uVar6;
switchD_00194786_default:
  if ((char)encoding < '\0') {
    location = RangeSink::TranslateVMToFile(sink,address);
    if (is_64bit) {
      address = ReadFixed<unsigned_long,8ul>(&location);
    }
    else {
      uVar5 = ReadFixed<unsigned_int,4ul>(&location);
      address = (unsigned_long)uVar5;
    }
  }
  return address;
}

Assistant:

uint64_t ReadEncodedPointer(uint8_t encoding, bool is_64bit, string_view* data,
                            const char* data_base, RangeSink* sink) {
  uint64_t value;
  const char* ptr = data->data();
  uint8_t format = encoding & DW_EH_PE_FORMAT_MASK;

  switch (format) {
    case DW_EH_PE_omit:
      return 0;
    case DW_EH_PE_absptr:
      if (is_64bit) {
        value = ReadFixed<uint64_t>(data);
      } else {
        value = ReadFixed<uint32_t>(data);
      }
      break;
    case DW_EH_PE_uleb128:
      value = dwarf::ReadLEB128<uint64_t>(data);
      break;
    case DW_EH_PE_udata2:
      value = ReadFixed<uint16_t>(data);
      break;
    case DW_EH_PE_udata4:
      value = ReadFixed<uint32_t>(data);
      break;
    case DW_EH_PE_udata8:
      value = ReadFixed<uint64_t>(data);
      break;
    case DW_EH_PE_sleb128:
      value = dwarf::ReadLEB128<int64_t>(data);
      break;
    case DW_EH_PE_sdata2:
      value = ReadFixed<int16_t>(data);
      break;
    case DW_EH_PE_sdata4:
      value = ReadFixed<int32_t>(data);
      break;
    case DW_EH_PE_sdata8:
      value = ReadFixed<int64_t>(data);
      break;
    default:
      THROWF("Unexpected eh_frame format value: $0", format);
  }

  uint8_t application = encoding & DW_EH_PE_APPLICATION_MASK;

  switch (application) {
    case 0:
      break;
    case DW_EH_PE_pcrel:
      value += sink->TranslateFileToVM(ptr);
      break;
    case DW_EH_PE_datarel:
      if (data_base == nullptr) {
        THROW("datarel requested but no data_base provided");
      }
      value += sink->TranslateFileToVM(data_base);
      break;
    case DW_EH_PE_textrel:
    case DW_EH_PE_funcrel:
    case DW_EH_PE_aligned:
      THROWF("Unimplemented eh_frame application value: $0", application);
  }

  if (encoding & DW_EH_PE_indirect) {
    string_view location = sink->TranslateVMToFile(value);
    if (is_64bit) {
      value = ReadFixed<uint64_t>(&location);
    } else {
      value = ReadFixed<uint32_t>(&location);
    }
  }

  return value;
}